

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.hpp
# Opt level: O1

JsonRpcException * __thiscall
jsonrpccxx::Dispatcher::process_type_error
          (JsonRpcException *__return_storage_ptr__,Dispatcher *this,string *name,
          JsonRpcException *e)

{
  value_t vVar1;
  int iVar2;
  array_t *paVar3;
  pointer pcVar4;
  uint __val;
  char cVar5;
  char cVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  long *plVar9;
  uint uVar10;
  size_type *psVar11;
  bool bVar12;
  uint ret;
  string message;
  uint ret_1;
  size_type *local_98;
  long local_90;
  size_type local_88;
  long lStack_80;
  uint local_74;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar2 = e->code;
  if ((iVar2 != -0x7f5a) || (vVar1 = (e->data).m_type, vVar1 == null)) goto LAB_001213ec;
  if (vVar1 == object) {
    bVar12 = (((e->data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0;
LAB_001213e5:
    if (bVar12) {
LAB_001213ec:
      *(undefined ***)__return_storage_ptr__ = &PTR__JsonRpcException_001704e8;
      __return_storage_ptr__->code = iVar2;
      (__return_storage_ptr__->message)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->message).field_2;
      pcVar4 = (e->message)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->message,pcVar4,
                 pcVar4 + (e->message)._M_string_length);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&__return_storage_ptr__->data,&e->data);
      (__return_storage_ptr__->err)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->err).field_2;
      pcVar4 = (e->err)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->err,pcVar4,pcVar4 + (e->err)._M_string_length);
      return __return_storage_ptr__;
    }
  }
  else if (vVar1 == array) {
    paVar3 = (e->data).m_value.array;
    bVar12 = (paVar3->
             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start ==
             (paVar3->
             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    goto LAB_001213e5;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar4 = (e->message)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar4,pcVar4 + (e->message)._M_string_length);
  std::__cxx11::string::append((char *)&local_70);
  iVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::find(&(this->mapping)._M_t,name);
  if ((_Rb_tree_header *)iVar7._M_node == &(this->mapping)._M_t._M_impl.super__Rb_tree_header) {
    local_50._M_dataplus._M_p._0_4_ = 0;
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_int,_0>
              (&e->data,(uint *)&local_50);
    __val = (uint)local_50._M_dataplus._M_p;
    cVar6 = '\x01';
    if (9 < (uint)local_50._M_dataplus._M_p) {
      uVar10 = (uint)local_50._M_dataplus._M_p;
      cVar5 = '\x04';
      do {
        cVar6 = cVar5;
        if (uVar10 < 100) {
          cVar6 = cVar6 + -2;
          goto LAB_001215e9;
        }
        if (uVar10 < 1000) {
          cVar6 = cVar6 + -1;
          goto LAB_001215e9;
        }
        if (uVar10 < 10000) goto LAB_001215e9;
        bVar12 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        cVar5 = cVar6 + '\x04';
      } while (bVar12);
      cVar6 = cVar6 + '\x01';
    }
LAB_001215e9:
    local_98 = &local_88;
    std::__cxx11::string::_M_construct((ulong)&local_98,cVar6);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_98,(uint)local_90,__val);
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_98);
    local_50.field_2._M_allocated_capacity = local_88;
    psVar11 = local_98;
    if (local_98 == &local_88) goto LAB_00121636;
  }
  else {
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::operator[](&this->mapping,name);
    local_74 = 0;
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_int,_0>
              (&e->data,&local_74);
    std::operator+(&local_50,"\"",
                   (pmVar8->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + local_74);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
    psVar11 = (size_type *)(plVar9 + 2);
    if ((size_type *)*plVar9 == psVar11) {
      local_88 = *psVar11;
      lStack_80 = plVar9[3];
      local_98 = &local_88;
    }
    else {
      local_88 = *psVar11;
      local_98 = (size_type *)*plVar9;
    }
    local_90 = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_98);
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    psVar11 = (size_type *)CONCAT44(local_50._M_dataplus._M_p._4_4_,(uint)local_50._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11 == &local_50.field_2) goto LAB_00121636;
  }
  operator_delete(psVar11,local_50.field_2._M_allocated_capacity + 1);
LAB_00121636:
  JsonRpcException::JsonRpcException(__return_storage_ptr__,e->code,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

JsonRpcException process_type_error(const std::string &name, JsonRpcException &e) {
      if (e.Code() == -32602 && !e.Data().empty()) {
        std::string message = e.Message() + " for parameter ";
        if (this->mapping.find(name) != this->mapping.end()) {
          message += "\"" + mapping[name][e.Data().get<unsigned int>()] + "\"";
        } else {
          message += std::to_string(e.Data().get<unsigned int>());
        }
        return JsonRpcException(e.Code(), message);
      }
      return e;
    }